

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::AddSettingsHandler(ImGuiSettingsHandler *handler)

{
  ImGuiContext *g;
  ImGuiSettingsHandler *in_stack_ffffffffffffffe8;
  
  ImVector<ImGuiSettingsHandler>::push_back
            ((ImVector<ImGuiSettingsHandler> *)GImGui,in_stack_ffffffffffffffe8);
  return;
}

Assistant:

void ImGui::AddSettingsHandler(const ImGuiSettingsHandler* handler)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(FindSettingsHandler(handler->TypeName) == NULL);
    g.SettingsHandlers.push_back(*handler);
}